

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double __thiscall NEST::NESTcalc::PhotonEnergy(NESTcalc *this,bool s2Flag,bool state,double tempK)

{
  bool bVar1;
  RandomGen *pRVar2;
  undefined8 local_38;
  double E_keV;
  double wavelength;
  double tempK_local;
  bool state_local;
  bool s2Flag_local;
  NESTcalc *this_local;
  
  bVar1 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (bVar1) {
    if (state) {
      pRVar2 = RandomGen::rndm();
      this_local = (NESTcalc *)
                   RandomGen::rand_zero_trunc_gauss(pRVar2,(double)0x4023666666666666,0.2);
    }
    else {
      pRVar2 = RandomGen::rndm();
      this_local = (NESTcalc *)RandomGen::rand_zero_trunc_gauss(pRVar2,9.69,0.22);
    }
  }
  else {
    if (state) {
      pRVar2 = RandomGen::rndm();
      E_keV = RandomGen::rand_zero_trunc_gauss(pRVar2,175.0,5.0);
    }
    else {
      pRVar2 = RandomGen::rndm();
      E_keV = RandomGen::rand_zero_trunc_gauss(pRVar2,178.0,5.9447983014862);
    }
    if (s2Flag) {
      if (200.0 <= tempK) {
        pRVar2 = RandomGen::rndm();
        E_keV = RandomGen::rand_zero_trunc_gauss(pRVar2,174.0,5.0);
      }
      else {
        pRVar2 = RandomGen::rndm();
        E_keV = RandomGen::rand_zero_trunc_gauss(pRVar2,179.0,5.0);
      }
    }
    local_38 = 1.24 / E_keV;
    if (0.0085 < local_38) {
      local_38 = 0.0085;
    }
    this_local = (NESTcalc *)(local_38 * 1000.0);
  }
  return (double)this_local;
}

Assistant:

double NESTcalc::PhotonEnergy(bool s2Flag, bool state, double tempK) {
  double wavelength, E_keV;  // wavelength is in nanometers

  if (ValidityTests::nearlyEqual(ATOM_NUM, 18.)) {
    // liquid Argon
    if (state) return RandomGen::rndm()->rand_zero_trunc_gauss(9.7, 0.2);
    return RandomGen::rndm()->rand_zero_trunc_gauss(9.69, 0.22);
  }

  if (!state)  // liquid or solid
    wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
        178., 14. / 2.355);  // taken from Jortner JchPh 42 '65
  else {                     // gas
    wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
        175., 5.);  // G4S1Light, probably Doke
  }
  if (s2Flag) {
    // S2 different from ordinary gas (or just measurement error?)
    if (tempK < 200.)  // cold gas
      wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(
          179., 5.);  // source is G4S2Light.cc from the old NEST
    else {
      wavelength = RandomGen::rndm()->rand_zero_trunc_gauss(174., 5.);  // ditto
    }
  }

  E_keV = 1240e-3 / wavelength;  // h*c in keV-nm divided by lambda in nm
  if (E_keV > W_SCINT)
    E_keV = W_SCINT;  // don't go so high breaks G4. Gauss in lambda -> non-G in
  // E, high tail

  return E_keV * 1000.;  // convert from keV into eV. Eventually add full T, P
                         // dependence
}